

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocalserver.cpp
# Opt level: O0

QLocalSocket * __thiscall QLocalServer::nextPendingConnection(QLocalServer *this)

{
  bool bVar1;
  QLocalServerPrivate *pQVar2;
  qsizetype qVar3;
  QLocalSocket *nextSocket;
  QLocalServerPrivate *d;
  QLocalSocket *local_8;
  
  pQVar2 = d_func((QLocalServer *)0x37cb17);
  bVar1 = QList<QLocalSocket_*>::isEmpty((QList<QLocalSocket_*> *)0x37cb2d);
  if (bVar1) {
    local_8 = (QLocalSocket *)0x0;
  }
  else {
    local_8 = QQueue<QLocalSocket_*>::dequeue((QQueue<QLocalSocket_*> *)0x37cb4f);
    qVar3 = QList<QLocalSocket_*>::size(&(pQVar2->pendingConnections).super_QList<QLocalSocket_*>);
    if (qVar3 <= pQVar2->maxPendingConnections) {
      QSocketNotifier::setEnabled(SUB81(pQVar2->socketNotifier,0));
    }
  }
  return local_8;
}

Assistant:

QLocalSocket *QLocalServer::nextPendingConnection()
{
    Q_D(QLocalServer);
    if (d->pendingConnections.isEmpty())
        return nullptr;
    QLocalSocket *nextSocket = d->pendingConnections.dequeue();
#ifndef QT_LOCALSOCKET_TCP
    if (d->pendingConnections.size() <= d->maxPendingConnections)
#ifndef Q_OS_WIN
        d->socketNotifier->setEnabled(true);
#else
        d->connectionEventNotifier->setEnabled(true);
#endif
#endif
    return nextSocket;
}